

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

int mi_reserve_huge_os_pages_at_ex
              (size_t pages,int numa_node,size_t timeout_msecs,_Bool exclusive,
              mi_arena_id_t *arena_id)

{
  mi_memid_t memid_00;
  mi_memid_t memid_01;
  _Bool _Var1;
  size_t sVar2;
  void *start;
  int iVar3;
  ulong uVar4;
  size_t hsize;
  mi_memid_t memid;
  size_t pages_reserved;
  
  if (arena_id != (mi_arena_id_t *)0x0) {
    *arena_id = -1;
  }
  if (pages == 0) {
    iVar3 = 0;
  }
  else {
    uVar4 = 0xffffffff;
    if (-1 < numa_node) {
      sVar2 = _mi_os_numa_node_count();
      uVar4 = (ulong)(uint)numa_node % sVar2;
    }
    hsize = 0;
    pages_reserved = 0;
    start = _mi_os_alloc_huge_os_pages(pages,(int)uVar4,timeout_msecs,&pages_reserved,&hsize,&memid)
    ;
    if (pages_reserved == 0 || start == (void *)0x0) {
      _mi_warning_message("failed to reserve %zu GiB huge pages\n",pages);
    }
    else {
      _mi_verbose_message("numa node %i: reserved %zu GiB huge pages (of the %zu GiB requested)\n",
                          uVar4 & 0xffffffff,pages_reserved,pages);
      memid_00.mem.os.size = memid.mem.os.size;
      memid_00.mem.os.base = memid.mem.os.base;
      memid_00.is_pinned = memid.is_pinned;
      memid_00.initially_committed = memid.initially_committed;
      memid_00.initially_zero = memid.initially_zero;
      memid_00._19_1_ = memid._19_1_;
      memid_00.memkind = memid.memkind;
      _Var1 = mi_manage_os_memory_ex2(start,hsize,true,(int)uVar4,exclusive,memid_00,arena_id);
      if (_Var1) {
        return 0;
      }
      memid_01.mem.os.size = memid.mem.os.size;
      memid_01.mem.os.base = memid.mem.os.base;
      memid_01.is_pinned = memid.is_pinned;
      memid_01.initially_committed = memid.initially_committed;
      memid_01.initially_zero = memid.initially_zero;
      memid_01._19_1_ = memid._19_1_;
      memid_01.memkind = memid.memkind;
      _mi_os_free(start,hsize,memid_01);
    }
    iVar3 = 0xc;
  }
  return iVar3;
}

Assistant:

int mi_reserve_huge_os_pages_at_ex(size_t pages, int numa_node, size_t timeout_msecs, bool exclusive, mi_arena_id_t* arena_id) mi_attr_noexcept {
  if (arena_id != NULL) *arena_id = -1;
  if (pages==0) return 0;
  if (numa_node < -1) numa_node = -1;
  if (numa_node >= 0) numa_node = numa_node % _mi_os_numa_node_count();
  size_t hsize = 0;
  size_t pages_reserved = 0;
  mi_memid_t memid;
  void* p = _mi_os_alloc_huge_os_pages(pages, numa_node, timeout_msecs, &pages_reserved, &hsize, &memid);
  if (p==NULL || pages_reserved==0) {
    _mi_warning_message("failed to reserve %zu GiB huge pages\n", pages);
    return ENOMEM;
  }
  _mi_verbose_message("numa node %i: reserved %zu GiB huge pages (of the %zu GiB requested)\n", numa_node, pages_reserved, pages);

  if (!mi_manage_os_memory_ex2(p, hsize, true, numa_node, exclusive, memid, arena_id)) {
    _mi_os_free(p, hsize, memid);
    return ENOMEM;
  }
  return 0;
}